

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void sqlcheck::CheckJoinCount(Configuration *state,string *sql_statement,bool *print_statement)

{
  char *pcVar1;
  allocator local_c9;
  string local_c8;
  string local_a8;
  char *local_88;
  char *message;
  size_t min_count;
  PatternType pattern_type;
  allocator local_61;
  string local_60 [8];
  string title;
  regex pattern;
  bool *print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8),
             "(\bjoin\b)",0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Reduce Number of JOINs",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  min_count._0_4_ = 3;
  message = (char *)0x5;
  local_88 = anon_var_dwarf_9053e;
  std::__cxx11::string::string((string *)&local_a8,local_60);
  pcVar1 = local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,pcVar1,&local_c9);
  CheckPattern(state,sql_statement,print_statement,(regex *)((long)&title.field_2 + 8),
               RISK_LEVEL_LOW,PATTERN_TYPE_QUERY,&local_a8,&local_c8,true,(size_t)message);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8));
  return;
}

Assistant:

void CheckJoinCount(Configuration& state,
                    const std::string& sql_statement,
                    bool& print_statement){

  std::regex pattern("(\bjoin\b)");
  std::string title = "Reduce Number of JOINs";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;
  std::size_t min_count = 5;

  auto message =
      "● Reduce Number of JOINs:  "
      "Too many JOINs is a symptom of complex spaghetti queries. Consider splitting "
      "up the complex query into many simpler queries, and reduce the number of JOINs";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_LOW,
               pattern_type,
               title,
               message,
               true,
               min_count);

}